

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packing_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Packing_x86::forward(Packing_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  Packing *this_00;
  uint _elempack;
  uint _w;
  uint _h;
  uint uVar1;
  uint uVar2;
  int *piVar3;
  ulong uVar4;
  _func_int **pp_Var5;
  size_t sVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  size_t sVar10;
  void *pvVar11;
  long lVar12;
  void *pvVar13;
  void *pvVar14;
  long lVar15;
  int iVar16;
  void *pvVar17;
  ulong uVar18;
  void *pvVar19;
  void *pvVar20;
  ulong uVar21;
  void *pvVar22;
  void *pvVar23;
  void *pvVar24;
  undefined4 *puVar25;
  void *pvVar26;
  uint uVar27;
  ulong uVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  
  uVar27 = bottom_blob->elempack;
  uVar28 = (ulong)uVar27;
  if (uVar28 == 0) {
    iVar8 = 0;
  }
  else {
    iVar8 = ((int)bottom_blob->elemsize << 3) / (int)uVar27;
  }
  if (iVar8 == 8) {
    iVar8 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar8;
  }
  this_00 = (Packing *)((long)&this->_vptr_Packing_x86 + (long)this->_vptr_Packing_x86[-3]);
  if ((*(int *)(&this->field_0xd4 + (long)this->_vptr_Packing_x86[-3]) == 0) && (iVar8 == 0x20)) {
    _elempack = this_00->out_elempack;
    uVar18 = (ulong)_elempack;
    if (uVar27 == _elempack) {
      if (top_blob == bottom_blob) {
        return 0;
      }
      piVar3 = bottom_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar3 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar3;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar8 = bottom_blob->w;
      iVar16 = bottom_blob->h;
      iVar7 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar8;
      top_blob->h = iVar16;
      top_blob->d = iVar7;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    uVar4 = bottom_blob->elemsize;
    bVar29 = uVar28 == 1;
    bVar30 = uVar18 == 4;
    bVar31 = uVar27 == 4;
    bVar32 = uVar18 == 1;
    bVar33 = uVar18 == 8;
    bVar34 = uVar28 == 8;
    if (((((bVar34 && bVar30) || (bVar31 && bVar33)) || (bVar32 && bVar34)) ||
        ((bVar29 && bVar33 || (bVar29 && bVar30)))) || (bVar31 && bVar32)) {
      iVar8 = bottom_blob->dims;
      _w = bottom_blob->w;
      _h = bottom_blob->h;
      uVar9 = (ulong)_h;
      iVar16 = bottom_blob->d;
      uVar1 = bottom_blob->c;
      uVar21 = (ulong)uVar1;
      uVar2 = _h;
      if ((((iVar8 == 2) || (uVar2 = _w, iVar8 == 1)) &&
          ((int)(uVar27 * uVar2) % (int)_elempack != 0)) ||
         ((iVar8 - 3U < 2 && ((int)(uVar27 * uVar1) % (int)_elempack != 0)))) {
        Mat::operator=(top_blob,bottom_blob);
      }
      else if (iVar8 == 2) {
        uVar27 = (int)(_h * uVar27) / (int)_elempack;
        Mat::create(top_blob,_w,uVar27,uVar18 * (uVar4 / uVar28),_elempack,opt->blob_allocator);
        pvVar23 = top_blob->data;
        if (pvVar23 == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        uVar28 = (ulong)uVar27;
        if ((bVar29 && bVar30) && 0 < (int)uVar27) {
          pvVar17 = bottom_blob->data;
          lVar12 = (long)bottom_blob->w * bottom_blob->elemsize;
          iVar8 = top_blob->w;
          sVar10 = top_blob->elemsize;
          pvVar19 = (void *)(lVar12 * 3 + (long)pvVar17);
          lVar15 = lVar12 * 4;
          pvVar11 = (void *)((long)pvVar17 + lVar12 * 2);
          pvVar13 = (void *)(lVar12 + (long)pvVar17);
          uVar18 = 0;
          do {
            if (0 < (int)_w) {
              puVar25 = (undefined4 *)((long)iVar8 * sVar10 * uVar18 + (long)pvVar23);
              lVar12 = 0;
              do {
                *puVar25 = *(undefined4 *)((long)pvVar17 + lVar12 * 4);
                puVar25[1] = *(undefined4 *)((long)pvVar13 + lVar12 * 4);
                puVar25[2] = *(undefined4 *)((long)pvVar11 + lVar12 * 4);
                puVar25[3] = *(undefined4 *)((long)pvVar19 + lVar12 * 4);
                puVar25 = puVar25 + 4;
                lVar12 = lVar12 + 1;
              } while (_w != (uint)lVar12);
            }
            uVar18 = uVar18 + 1;
            pvVar19 = (void *)((long)pvVar19 + lVar15);
            pvVar11 = (void *)((long)pvVar11 + lVar15);
            pvVar13 = (void *)((long)pvVar13 + lVar15);
            pvVar17 = (void *)((long)pvVar17 + lVar15);
          } while (uVar18 != uVar28);
        }
        if ((bVar31 && bVar32) && 0 < (int)_h) {
          iVar8 = bottom_blob->w;
          sVar10 = bottom_blob->elemsize;
          lVar12 = (long)top_blob->w * top_blob->elemsize;
          pvVar17 = bottom_blob->data;
          pvVar14 = (void *)(lVar12 * 3 + (long)pvVar23);
          lVar15 = lVar12 * 4;
          pvVar11 = (void *)((long)pvVar23 + lVar12 * 2);
          pvVar19 = (void *)(lVar12 + (long)pvVar23);
          uVar18 = 0;
          pvVar13 = pvVar23;
          do {
            if (0 < (int)_w) {
              puVar25 = (undefined4 *)((long)iVar8 * sVar10 * uVar18 + (long)pvVar17);
              lVar12 = 0;
              do {
                *(undefined4 *)((long)pvVar13 + lVar12 * 4) = *puVar25;
                *(undefined4 *)((long)pvVar19 + lVar12 * 4) = puVar25[1];
                *(undefined4 *)((long)pvVar11 + lVar12 * 4) = puVar25[2];
                *(undefined4 *)((long)pvVar14 + lVar12 * 4) = puVar25[3];
                puVar25 = puVar25 + 4;
                lVar12 = lVar12 + 1;
              } while (_w != (uint)lVar12);
            }
            uVar18 = uVar18 + 1;
            pvVar14 = (void *)((long)pvVar14 + lVar15);
            pvVar11 = (void *)((long)pvVar11 + lVar15);
            pvVar19 = (void *)((long)pvVar19 + lVar15);
            pvVar13 = (void *)((long)pvVar13 + lVar15);
          } while (uVar18 != uVar9);
        }
        if ((bVar29 && bVar33) && 0 < (int)uVar27) {
          lVar12 = (long)bottom_blob->w * bottom_blob->elemsize;
          iVar8 = top_blob->w;
          sVar10 = top_blob->elemsize;
          pvVar19 = bottom_blob->data;
          lVar15 = lVar12 * 8;
          pvVar26 = (void *)(lVar12 * 7 + (long)pvVar19);
          pvVar11 = (void *)((long)pvVar19 + lVar12 * 6);
          pvVar24 = (void *)(lVar12 * 5 + (long)pvVar19);
          pvVar17 = (void *)((long)pvVar19 + lVar12 * 4);
          pvVar22 = (void *)(lVar12 * 3 + (long)pvVar19);
          pvVar13 = (void *)((long)pvVar19 + lVar12 * 2);
          pvVar20 = (void *)(lVar12 + (long)pvVar19);
          uVar18 = 0;
          pvVar14 = pvVar23;
          do {
            if (0 < (int)_w) {
              lVar12 = 0;
              iVar16 = _w + 1;
              do {
                *(undefined4 *)((long)pvVar14 + lVar12 * 8) =
                     *(undefined4 *)((long)pvVar19 + lVar12);
                *(undefined4 *)((long)pvVar14 + lVar12 * 8 + 4) =
                     *(undefined4 *)((long)pvVar20 + lVar12);
                *(undefined4 *)((long)pvVar14 + lVar12 * 8 + 8) =
                     *(undefined4 *)((long)pvVar13 + lVar12);
                *(undefined4 *)((long)pvVar14 + lVar12 * 8 + 0xc) =
                     *(undefined4 *)((long)pvVar22 + lVar12);
                *(undefined4 *)((long)pvVar14 + lVar12 * 8 + 0x10) =
                     *(undefined4 *)((long)pvVar17 + lVar12);
                *(undefined4 *)((long)pvVar14 + lVar12 * 8 + 0x14) =
                     *(undefined4 *)((long)pvVar24 + lVar12);
                *(undefined4 *)((long)pvVar14 + lVar12 * 8 + 0x18) =
                     *(undefined4 *)((long)pvVar11 + lVar12);
                *(undefined4 *)((long)pvVar14 + lVar12 * 8 + 0x1c) =
                     *(undefined4 *)((long)pvVar26 + lVar12);
                iVar16 = iVar16 + -1;
                lVar12 = lVar12 + 4;
              } while (1 < iVar16);
            }
            uVar18 = uVar18 + 1;
            pvVar14 = (void *)((long)pvVar14 + (long)iVar8 * sVar10);
            pvVar26 = (void *)((long)pvVar26 + lVar15);
            pvVar11 = (void *)((long)pvVar11 + lVar15);
            pvVar24 = (void *)((long)pvVar24 + lVar15);
            pvVar17 = (void *)((long)pvVar17 + lVar15);
            pvVar22 = (void *)((long)pvVar22 + lVar15);
            pvVar13 = (void *)((long)pvVar13 + lVar15);
            pvVar20 = (void *)((long)pvVar20 + lVar15);
            pvVar19 = (void *)((long)pvVar19 + lVar15);
          } while (uVar18 != uVar28);
        }
        if ((bVar32 && bVar34) && 0 < (int)_h) {
          pvVar19 = bottom_blob->data;
          iVar8 = bottom_blob->w;
          lVar12 = (long)top_blob->w * top_blob->elemsize;
          lVar15 = lVar12 * 8;
          pvVar26 = (void *)(lVar12 * 7 + (long)pvVar23);
          pvVar11 = (void *)((long)pvVar23 + lVar12 * 6);
          pvVar20 = (void *)(lVar12 * 5 + (long)pvVar23);
          pvVar17 = (void *)((long)pvVar23 + lVar12 * 4);
          pvVar22 = (void *)(lVar12 * 3 + (long)pvVar23);
          pvVar13 = (void *)((long)pvVar23 + lVar12 * 2);
          pvVar24 = (void *)(lVar12 + (long)pvVar23);
          sVar10 = bottom_blob->elemsize;
          uVar18 = 0;
          pvVar14 = pvVar23;
          do {
            if (0 < (int)_w) {
              lVar12 = 0;
              iVar16 = _w + 1;
              do {
                *(undefined4 *)((long)pvVar14 + lVar12) =
                     *(undefined4 *)((long)pvVar19 + lVar12 * 8);
                *(undefined4 *)((long)pvVar24 + lVar12) =
                     *(undefined4 *)((long)pvVar19 + lVar12 * 8 + 4);
                *(undefined4 *)((long)pvVar13 + lVar12) =
                     *(undefined4 *)((long)pvVar19 + lVar12 * 8 + 8);
                *(undefined4 *)((long)pvVar22 + lVar12) =
                     *(undefined4 *)((long)pvVar19 + lVar12 * 8 + 0xc);
                *(undefined4 *)((long)pvVar17 + lVar12) =
                     *(undefined4 *)((long)pvVar19 + lVar12 * 8 + 0x10);
                *(undefined4 *)((long)pvVar20 + lVar12) =
                     *(undefined4 *)((long)pvVar19 + lVar12 * 8 + 0x14);
                *(undefined4 *)((long)pvVar11 + lVar12) =
                     *(undefined4 *)((long)pvVar19 + lVar12 * 8 + 0x18);
                *(undefined4 *)((long)pvVar26 + lVar12) =
                     *(undefined4 *)((long)pvVar19 + lVar12 * 8 + 0x1c);
                iVar16 = iVar16 + -1;
                lVar12 = lVar12 + 4;
              } while (1 < iVar16);
            }
            uVar18 = uVar18 + 1;
            pvVar26 = (void *)((long)pvVar26 + lVar15);
            pvVar11 = (void *)((long)pvVar11 + lVar15);
            pvVar20 = (void *)((long)pvVar20 + lVar15);
            pvVar17 = (void *)((long)pvVar17 + lVar15);
            pvVar22 = (void *)((long)pvVar22 + lVar15);
            pvVar13 = (void *)((long)pvVar13 + lVar15);
            pvVar24 = (void *)((long)pvVar24 + lVar15);
            pvVar14 = (void *)((long)pvVar14 + lVar15);
            pvVar19 = (void *)((long)pvVar19 + (long)iVar8 * sVar10);
          } while (uVar18 != uVar9);
        }
        if ((bVar31 && bVar33) && 0 < (int)uVar27) {
          lVar15 = (long)bottom_blob->w * bottom_blob->elemsize;
          pvVar17 = bottom_blob->data;
          iVar8 = top_blob->w;
          sVar10 = top_blob->elemsize;
          pvVar11 = (void *)((long)pvVar17 + lVar15);
          lVar15 = lVar15 * 2;
          uVar18 = 0;
          pvVar13 = pvVar23;
          do {
            if (0 < (int)_w) {
              lVar12 = 0;
              uVar27 = _w;
              do {
                *(undefined4 *)((long)pvVar13 + lVar12 * 2) =
                     *(undefined4 *)((long)pvVar17 + lVar12);
                *(undefined4 *)((long)pvVar13 + lVar12 * 2 + 4) =
                     *(undefined4 *)((long)pvVar17 + lVar12 + 4);
                *(undefined4 *)((long)pvVar13 + lVar12 * 2 + 8) =
                     *(undefined4 *)((long)pvVar17 + lVar12 + 8);
                *(undefined4 *)((long)pvVar13 + lVar12 * 2 + 0xc) =
                     *(undefined4 *)((long)pvVar17 + lVar12 + 0xc);
                *(undefined4 *)((long)pvVar13 + lVar12 * 2 + 0x10) =
                     *(undefined4 *)((long)pvVar11 + lVar12);
                *(undefined4 *)((long)pvVar13 + lVar12 * 2 + 0x14) =
                     *(undefined4 *)((long)pvVar11 + lVar12 + 4);
                *(undefined4 *)((long)pvVar13 + lVar12 * 2 + 0x18) =
                     *(undefined4 *)((long)pvVar11 + lVar12 + 8);
                *(undefined4 *)((long)pvVar13 + lVar12 * 2 + 0x1c) =
                     *(undefined4 *)((long)pvVar11 + lVar12 + 0xc);
                lVar12 = lVar12 + 0x10;
                uVar27 = uVar27 - 1;
              } while (uVar27 != 0);
            }
            uVar18 = uVar18 + 1;
            pvVar13 = (void *)((long)pvVar13 + (long)iVar8 * sVar10);
            pvVar11 = (void *)((long)pvVar11 + lVar15);
            pvVar17 = (void *)((long)pvVar17 + lVar15);
          } while (uVar18 != uVar28);
        }
        if ((bVar34 && bVar30) && 0 < (int)_h) {
          pvVar17 = bottom_blob->data;
          iVar8 = bottom_blob->w;
          lVar15 = (long)top_blob->w * top_blob->elemsize;
          pvVar11 = (void *)((long)pvVar23 + lVar15);
          lVar15 = lVar15 * 2;
          sVar10 = bottom_blob->elemsize;
          uVar28 = 0;
          do {
            if (0 < (int)_w) {
              lVar12 = 0;
              uVar27 = _w;
              do {
                *(undefined4 *)((long)pvVar23 + lVar12) =
                     *(undefined4 *)((long)pvVar17 + lVar12 * 2);
                *(undefined4 *)((long)pvVar23 + lVar12 + 4) =
                     *(undefined4 *)((long)pvVar17 + lVar12 * 2 + 4);
                *(undefined4 *)((long)pvVar23 + lVar12 + 8) =
                     *(undefined4 *)((long)pvVar17 + lVar12 * 2 + 8);
                *(undefined4 *)((long)pvVar23 + lVar12 + 0xc) =
                     *(undefined4 *)((long)pvVar17 + lVar12 * 2 + 0xc);
                *(undefined4 *)((long)pvVar11 + lVar12) =
                     *(undefined4 *)((long)pvVar17 + lVar12 * 2 + 0x10);
                *(undefined4 *)((long)pvVar11 + lVar12 + 4) =
                     *(undefined4 *)((long)pvVar17 + lVar12 * 2 + 0x14);
                *(undefined4 *)((long)pvVar11 + lVar12 + 8) =
                     *(undefined4 *)((long)pvVar17 + lVar12 * 2 + 0x18);
                *(undefined4 *)((long)pvVar11 + lVar12 + 0xc) =
                     *(undefined4 *)((long)pvVar17 + lVar12 * 2 + 0x1c);
                lVar12 = lVar12 + 0x10;
                uVar27 = uVar27 - 1;
              } while (uVar27 != 0);
            }
            uVar28 = uVar28 + 1;
            pvVar11 = (void *)((long)pvVar11 + lVar15);
            pvVar23 = (void *)((long)pvVar23 + lVar15);
            pvVar17 = (void *)((long)pvVar17 + (long)iVar8 * sVar10);
          } while (uVar28 != uVar9);
          return 0;
        }
      }
      else {
        if (iVar8 == 1) {
          Mat::operator=(top_blob,bottom_blob);
          pp_Var5 = this->_vptr_Packing_x86;
          top_blob->w = (int)(_w * uVar27) / *(int *)(&this->field_0xd0 + (long)pp_Var5[-3]);
          top_blob->cstep =
               (long)((int)(_w * uVar27) / *(int *)(&this->field_0xd0 + (long)pp_Var5[-3]));
          top_blob->elemsize =
               (long)*(int *)(&this->field_0xd0 + (long)pp_Var5[-3]) * (uVar4 / uVar28);
          top_blob->elempack = *(int *)(&this->field_0xd0 + (long)pp_Var5[-3]);
          return 0;
        }
        if (iVar8 - 3U < 2) {
          uVar27 = (int)(uVar27 * uVar1) / (int)_elempack;
          sVar10 = (uVar4 / uVar28) * uVar18;
          if (iVar8 == 3) {
            Mat::create(top_blob,_w,_h,uVar27,sVar10,_elempack,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,_w,_h,iVar16,uVar27,sVar10,_elempack,opt->blob_allocator);
          }
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep == 0) {
            return -100;
          }
          iVar16 = _h * _w * iVar16;
          if ((bVar29 && bVar30) && 0 < (int)uVar27) {
            pvVar11 = bottom_blob->data;
            pvVar17 = top_blob->data;
            sVar10 = top_blob->cstep;
            sVar6 = top_blob->elemsize;
            lVar12 = bottom_blob->cstep * bottom_blob->elemsize;
            pvVar19 = (void *)(lVar12 * 3 + (long)pvVar11);
            lVar15 = lVar12 * 4;
            pvVar23 = (void *)((long)pvVar11 + lVar12 * 2);
            pvVar13 = (void *)(lVar12 + (long)pvVar11);
            uVar28 = 0;
            do {
              if (0 < iVar16) {
                puVar25 = (undefined4 *)(sVar10 * sVar6 * uVar28 + (long)pvVar17);
                lVar12 = 0;
                do {
                  *puVar25 = *(undefined4 *)((long)pvVar11 + lVar12 * 4);
                  puVar25[1] = *(undefined4 *)((long)pvVar13 + lVar12 * 4);
                  puVar25[2] = *(undefined4 *)((long)pvVar23 + lVar12 * 4);
                  puVar25[3] = *(undefined4 *)((long)pvVar19 + lVar12 * 4);
                  puVar25 = puVar25 + 4;
                  lVar12 = lVar12 + 1;
                } while (iVar16 != (int)lVar12);
              }
              uVar28 = uVar28 + 1;
              pvVar19 = (void *)((long)pvVar19 + lVar15);
              pvVar23 = (void *)((long)pvVar23 + lVar15);
              pvVar13 = (void *)((long)pvVar13 + lVar15);
              pvVar11 = (void *)((long)pvVar11 + lVar15);
            } while (uVar28 != uVar27);
          }
          if ((bVar31 && bVar32) && 0 < (int)uVar1) {
            pvVar11 = bottom_blob->data;
            sVar10 = bottom_blob->cstep;
            lVar12 = top_blob->cstep * top_blob->elemsize;
            sVar6 = bottom_blob->elemsize;
            pvVar17 = top_blob->data;
            pvVar19 = (void *)(lVar12 * 3 + (long)pvVar17);
            lVar15 = lVar12 * 4;
            pvVar23 = (void *)((long)pvVar17 + lVar12 * 2);
            pvVar13 = (void *)(lVar12 + (long)pvVar17);
            uVar28 = 0;
            do {
              if (0 < iVar16) {
                puVar25 = (undefined4 *)(sVar10 * sVar6 * uVar28 + (long)pvVar11);
                lVar12 = 0;
                do {
                  *(undefined4 *)((long)pvVar17 + lVar12 * 4) = *puVar25;
                  *(undefined4 *)((long)pvVar13 + lVar12 * 4) = puVar25[1];
                  *(undefined4 *)((long)pvVar23 + lVar12 * 4) = puVar25[2];
                  *(undefined4 *)((long)pvVar19 + lVar12 * 4) = puVar25[3];
                  puVar25 = puVar25 + 4;
                  lVar12 = lVar12 + 1;
                } while (iVar16 != (int)lVar12);
              }
              uVar28 = uVar28 + 1;
              pvVar19 = (void *)((long)pvVar19 + lVar15);
              pvVar23 = (void *)((long)pvVar23 + lVar15);
              pvVar13 = (void *)((long)pvVar13 + lVar15);
              pvVar17 = (void *)((long)pvVar17 + lVar15);
            } while (uVar28 != uVar21);
          }
          if ((bVar29 && bVar33) && 0 < (int)uVar27) {
            pvVar13 = bottom_blob->data;
            pvVar19 = top_blob->data;
            sVar10 = top_blob->cstep;
            lVar12 = bottom_blob->cstep * bottom_blob->elemsize;
            sVar6 = top_blob->elemsize;
            lVar15 = lVar12 * 8;
            pvVar20 = (void *)(lVar12 * 7 + (long)pvVar13);
            pvVar23 = (void *)((long)pvVar13 + lVar12 * 6);
            pvVar26 = (void *)(lVar12 * 5 + (long)pvVar13);
            pvVar11 = (void *)((long)pvVar13 + lVar12 * 4);
            pvVar24 = (void *)(lVar12 * 3 + (long)pvVar13);
            pvVar17 = (void *)((long)pvVar13 + lVar12 * 2);
            pvVar14 = (void *)(lVar12 + (long)pvVar13);
            uVar28 = 0;
            do {
              if (0 < iVar16) {
                lVar12 = 0;
                iVar8 = iVar16 + 1;
                do {
                  *(undefined4 *)((long)pvVar19 + lVar12 * 8) =
                       *(undefined4 *)((long)pvVar13 + lVar12);
                  *(undefined4 *)((long)pvVar19 + lVar12 * 8 + 4) =
                       *(undefined4 *)((long)pvVar14 + lVar12);
                  *(undefined4 *)((long)pvVar19 + lVar12 * 8 + 8) =
                       *(undefined4 *)((long)pvVar17 + lVar12);
                  *(undefined4 *)((long)pvVar19 + lVar12 * 8 + 0xc) =
                       *(undefined4 *)((long)pvVar24 + lVar12);
                  *(undefined4 *)((long)pvVar19 + lVar12 * 8 + 0x10) =
                       *(undefined4 *)((long)pvVar11 + lVar12);
                  *(undefined4 *)((long)pvVar19 + lVar12 * 8 + 0x14) =
                       *(undefined4 *)((long)pvVar26 + lVar12);
                  *(undefined4 *)((long)pvVar19 + lVar12 * 8 + 0x18) =
                       *(undefined4 *)((long)pvVar23 + lVar12);
                  *(undefined4 *)((long)pvVar19 + lVar12 * 8 + 0x1c) =
                       *(undefined4 *)((long)pvVar20 + lVar12);
                  iVar8 = iVar8 + -1;
                  lVar12 = lVar12 + 4;
                } while (1 < iVar8);
              }
              uVar28 = uVar28 + 1;
              pvVar19 = (void *)((long)pvVar19 + sVar10 * sVar6);
              pvVar20 = (void *)((long)pvVar20 + lVar15);
              pvVar23 = (void *)((long)pvVar23 + lVar15);
              pvVar26 = (void *)((long)pvVar26 + lVar15);
              pvVar11 = (void *)((long)pvVar11 + lVar15);
              pvVar24 = (void *)((long)pvVar24 + lVar15);
              pvVar17 = (void *)((long)pvVar17 + lVar15);
              pvVar14 = (void *)((long)pvVar14 + lVar15);
              pvVar13 = (void *)((long)pvVar13 + lVar15);
            } while (uVar28 != uVar27);
          }
          if ((bVar32 && bVar34) && 0 < (int)uVar1) {
            pvVar13 = bottom_blob->data;
            sVar10 = bottom_blob->cstep;
            pvVar19 = top_blob->data;
            lVar12 = top_blob->cstep * top_blob->elemsize;
            lVar15 = lVar12 * 8;
            pvVar20 = (void *)(lVar12 * 7 + (long)pvVar19);
            pvVar23 = (void *)((long)pvVar19 + lVar12 * 6);
            pvVar26 = (void *)(lVar12 * 5 + (long)pvVar19);
            pvVar11 = (void *)((long)pvVar19 + lVar12 * 4);
            pvVar24 = (void *)(lVar12 * 3 + (long)pvVar19);
            pvVar17 = (void *)((long)pvVar19 + lVar12 * 2);
            pvVar14 = (void *)(lVar12 + (long)pvVar19);
            sVar6 = bottom_blob->elemsize;
            uVar28 = 0;
            do {
              if (0 < iVar16) {
                lVar12 = 0;
                iVar8 = iVar16 + 1;
                do {
                  *(undefined4 *)((long)pvVar19 + lVar12) =
                       *(undefined4 *)((long)pvVar13 + lVar12 * 8);
                  *(undefined4 *)((long)pvVar14 + lVar12) =
                       *(undefined4 *)((long)pvVar13 + lVar12 * 8 + 4);
                  *(undefined4 *)((long)pvVar17 + lVar12) =
                       *(undefined4 *)((long)pvVar13 + lVar12 * 8 + 8);
                  *(undefined4 *)((long)pvVar24 + lVar12) =
                       *(undefined4 *)((long)pvVar13 + lVar12 * 8 + 0xc);
                  *(undefined4 *)((long)pvVar11 + lVar12) =
                       *(undefined4 *)((long)pvVar13 + lVar12 * 8 + 0x10);
                  *(undefined4 *)((long)pvVar26 + lVar12) =
                       *(undefined4 *)((long)pvVar13 + lVar12 * 8 + 0x14);
                  *(undefined4 *)((long)pvVar23 + lVar12) =
                       *(undefined4 *)((long)pvVar13 + lVar12 * 8 + 0x18);
                  *(undefined4 *)((long)pvVar20 + lVar12) =
                       *(undefined4 *)((long)pvVar13 + lVar12 * 8 + 0x1c);
                  iVar8 = iVar8 + -1;
                  lVar12 = lVar12 + 4;
                } while (1 < iVar8);
              }
              uVar28 = uVar28 + 1;
              pvVar20 = (void *)((long)pvVar20 + lVar15);
              pvVar23 = (void *)((long)pvVar23 + lVar15);
              pvVar26 = (void *)((long)pvVar26 + lVar15);
              pvVar11 = (void *)((long)pvVar11 + lVar15);
              pvVar24 = (void *)((long)pvVar24 + lVar15);
              pvVar17 = (void *)((long)pvVar17 + lVar15);
              pvVar14 = (void *)((long)pvVar14 + lVar15);
              pvVar19 = (void *)((long)pvVar19 + lVar15);
              pvVar13 = (void *)((long)pvVar13 + sVar10 * sVar6);
            } while (uVar28 != uVar21);
          }
          if ((bVar31 && bVar33) && 0 < (int)uVar27) {
            pvVar11 = bottom_blob->data;
            pvVar17 = top_blob->data;
            sVar10 = top_blob->cstep;
            sVar6 = top_blob->elemsize;
            lVar15 = bottom_blob->cstep * bottom_blob->elemsize;
            pvVar23 = (void *)((long)pvVar11 + lVar15);
            lVar15 = lVar15 * 2;
            uVar28 = 0;
            do {
              if (0 < iVar16) {
                lVar12 = 0;
                iVar8 = iVar16;
                do {
                  *(undefined4 *)((long)pvVar17 + lVar12 * 2) =
                       *(undefined4 *)((long)pvVar11 + lVar12);
                  *(undefined4 *)((long)pvVar17 + lVar12 * 2 + 4) =
                       *(undefined4 *)((long)pvVar11 + lVar12 + 4);
                  *(undefined4 *)((long)pvVar17 + lVar12 * 2 + 8) =
                       *(undefined4 *)((long)pvVar11 + lVar12 + 8);
                  *(undefined4 *)((long)pvVar17 + lVar12 * 2 + 0xc) =
                       *(undefined4 *)((long)pvVar11 + lVar12 + 0xc);
                  *(undefined4 *)((long)pvVar17 + lVar12 * 2 + 0x10) =
                       *(undefined4 *)((long)pvVar23 + lVar12);
                  *(undefined4 *)((long)pvVar17 + lVar12 * 2 + 0x14) =
                       *(undefined4 *)((long)pvVar23 + lVar12 + 4);
                  *(undefined4 *)((long)pvVar17 + lVar12 * 2 + 0x18) =
                       *(undefined4 *)((long)pvVar23 + lVar12 + 8);
                  *(undefined4 *)((long)pvVar17 + lVar12 * 2 + 0x1c) =
                       *(undefined4 *)((long)pvVar23 + lVar12 + 0xc);
                  lVar12 = lVar12 + 0x10;
                  iVar8 = iVar8 + -1;
                } while (iVar8 != 0);
              }
              uVar28 = uVar28 + 1;
              pvVar17 = (void *)((long)pvVar17 + sVar10 * sVar6);
              pvVar23 = (void *)((long)pvVar23 + lVar15);
              pvVar11 = (void *)((long)pvVar11 + lVar15);
            } while (uVar28 != uVar27);
          }
          if ((bVar34 && bVar30) && 0 < (int)uVar1) {
            pvVar11 = bottom_blob->data;
            sVar10 = bottom_blob->cstep;
            lVar15 = top_blob->cstep * top_blob->elemsize;
            sVar6 = bottom_blob->elemsize;
            pvVar17 = top_blob->data;
            pvVar23 = (void *)((long)pvVar17 + lVar15);
            lVar15 = lVar15 * 2;
            uVar28 = 0;
            do {
              if (0 < iVar16) {
                lVar12 = 0;
                iVar8 = iVar16;
                do {
                  *(undefined4 *)((long)pvVar17 + lVar12) =
                       *(undefined4 *)((long)pvVar11 + lVar12 * 2);
                  *(undefined4 *)((long)pvVar17 + lVar12 + 4) =
                       *(undefined4 *)((long)pvVar11 + lVar12 * 2 + 4);
                  *(undefined4 *)((long)pvVar17 + lVar12 + 8) =
                       *(undefined4 *)((long)pvVar11 + lVar12 * 2 + 8);
                  *(undefined4 *)((long)pvVar17 + lVar12 + 0xc) =
                       *(undefined4 *)((long)pvVar11 + lVar12 * 2 + 0xc);
                  *(undefined4 *)((long)pvVar23 + lVar12) =
                       *(undefined4 *)((long)pvVar11 + lVar12 * 2 + 0x10);
                  *(undefined4 *)((long)pvVar23 + lVar12 + 4) =
                       *(undefined4 *)((long)pvVar11 + lVar12 * 2 + 0x14);
                  *(undefined4 *)((long)pvVar23 + lVar12 + 8) =
                       *(undefined4 *)((long)pvVar11 + lVar12 * 2 + 0x18);
                  *(undefined4 *)((long)pvVar23 + lVar12 + 0xc) =
                       *(undefined4 *)((long)pvVar11 + lVar12 * 2 + 0x1c);
                  lVar12 = lVar12 + 0x10;
                  iVar8 = iVar8 + -1;
                } while (iVar8 != 0);
              }
              uVar28 = uVar28 + 1;
              pvVar23 = (void *)((long)pvVar23 + lVar15);
              pvVar17 = (void *)((long)pvVar17 + lVar15);
              pvVar11 = (void *)((long)pvVar11 + sVar10 * sVar6);
            } while (uVar28 != uVar21);
            return 0;
          }
        }
      }
      return 0;
    }
  }
  iVar8 = Packing::forward(this_00,bottom_blob,top_blob,opt);
  return iVar8;
}

Assistant:

int Packing_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    if (use_padding)
    {
        return Packing::forward(bottom_blob, top_blob, opt);
    }

    if (elembits != 32)
    {
        // non-fp32 type
        return Packing::forward(bottom_blob, top_blob, opt);
    }

    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    if (elempack == out_elempack)
    {
        top_blob = bottom_blob;
        return 0;
    }

    bool pack1to4 = elempack == 1 && out_elempack == 4;
    bool pack4to1 = elempack == 4 && out_elempack == 1;
    bool pack1to8 = elempack == 1 && out_elempack == 8;
    bool pack8to1 = elempack == 8 && out_elempack == 1;
    bool pack4to8 = elempack == 4 && out_elempack == 8;
    bool pack8to4 = elempack == 8 && out_elempack == 4;

    if (!pack1to4 && !pack4to1 && !pack1to8 && !pack8to1 && !pack4to8 && !pack8to4)
    {
        return Packing::forward(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    if (!use_padding)
    {
        // identity if use_padding not allowed
        if (dims == 1 && w * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if (dims == 2 && h * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if ((dims == 3 || dims == 4) && channels * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }

    if (dims == 1)
    {
        top_blob = bottom_blob;
        top_blob.w = w * elempack / out_elempack;
        top_blob.cstep = w * elempack / out_elempack;
        top_blob.elemsize = elemsize / elempack * out_elempack;
        top_blob.elempack = out_elempack;
        return 0;
    }

    if (dims == 2)
    {
        int outh = h * elempack / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pack1to4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* r0 = bottom_blob.row(i * 4);
                const float* r1 = bottom_blob.row(i * 4 + 1);
                const float* r2 = bottom_blob.row(i * 4 + 2);
                const float* r3 = bottom_blob.row(i * 4 + 3);

                float* outptr = top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;

                    outptr += 4;
                }
            }
        }
        if (pack4to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* r0 = bottom_blob.row(i);

                float* outptr0 = top_blob.row(i * 4);
                float* outptr1 = top_blob.row(i * 4 + 1);
                float* outptr2 = top_blob.row(i * 4 + 2);
                float* outptr3 = top_blob.row(i * 4 + 3);

                for (int j = 0; j < w; j++)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];

                    r0 += 4;
                }
            }
        }
        if (pack1to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* r0 = bottom_blob.row(i * 8);
                const float* r1 = bottom_blob.row(i * 8 + 1);
                const float* r2 = bottom_blob.row(i * 8 + 2);
                const float* r3 = bottom_blob.row(i * 8 + 3);
                const float* r4 = bottom_blob.row(i * 8 + 4);
                const float* r5 = bottom_blob.row(i * 8 + 5);
                const float* r6 = bottom_blob.row(i * 8 + 6);
                const float* r7 = bottom_blob.row(i * 8 + 7);

                float* outptr = top_blob.row(i);

#if __AVX__
                int nn = w >> 3;
                int remain = w & 7;
                for (; nn > 0; nn--)
                {
                    __m256 _row0 = _mm256_loadu_ps(r0);
                    __m256 _row1 = _mm256_loadu_ps(r1);
                    __m256 _row2 = _mm256_loadu_ps(r2);
                    __m256 _row3 = _mm256_loadu_ps(r3);
                    __m256 _row4 = _mm256_loadu_ps(r4);
                    __m256 _row5 = _mm256_loadu_ps(r5);
                    __m256 _row6 = _mm256_loadu_ps(r6);
                    __m256 _row7 = _mm256_loadu_ps(r7);
                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);
                    _mm256_storeu_ps(outptr, _row0);
                    _mm256_storeu_ps(outptr + 8, _row1);
                    _mm256_storeu_ps(outptr + 16, _row2);
                    _mm256_storeu_ps(outptr + 24, _row3);
                    _mm256_storeu_ps(outptr + 32, _row4);
                    _mm256_storeu_ps(outptr + 40, _row5);
                    _mm256_storeu_ps(outptr + 48, _row6);
                    _mm256_storeu_ps(outptr + 56, _row7);
                    r0 += 8;
                    r1 += 8;
                    r2 += 8;
                    r3 += 8;
                    r4 += 8;
                    r5 += 8;
                    r6 += 8;
                    r7 += 8;
                    outptr += 64;
                }
#else
                int remain = w;
#endif

                for (; remain > 0; remain--)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;
                    outptr[4] = *r4++;
                    outptr[5] = *r5++;
                    outptr[6] = *r6++;
                    outptr[7] = *r7++;

                    outptr += 8;
                }
            }
        }
        if (pack8to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* r0 = bottom_blob.row(i);

                float* outptr0 = top_blob.row(i * 8);
                float* outptr1 = top_blob.row(i * 8 + 1);
                float* outptr2 = top_blob.row(i * 8 + 2);
                float* outptr3 = top_blob.row(i * 8 + 3);
                float* outptr4 = top_blob.row(i * 8 + 4);
                float* outptr5 = top_blob.row(i * 8 + 5);
                float* outptr6 = top_blob.row(i * 8 + 6);
                float* outptr7 = top_blob.row(i * 8 + 7);
#if __AVX__
                int nn = w >> 3;
                int remain = w & 7;
#else
                int remain = w;
#endif

#if __AVX__
                for (; nn > 0; nn--)
                {
                    __m256 _row0 = _mm256_loadu_ps(r0);
                    __m256 _row1 = _mm256_loadu_ps(r0 + 8);
                    __m256 _row2 = _mm256_loadu_ps(r0 + 16);
                    __m256 _row3 = _mm256_loadu_ps(r0 + 24);
                    __m256 _row4 = _mm256_loadu_ps(r0 + 32);
                    __m256 _row5 = _mm256_loadu_ps(r0 + 40);
                    __m256 _row6 = _mm256_loadu_ps(r0 + 48);
                    __m256 _row7 = _mm256_loadu_ps(r0 + 56);
                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);
                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    r0 += 64;
                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                }
#endif
                for (; remain > 0; remain--)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];
                    *outptr4++ = r0[4];
                    *outptr5++ = r0[5];
                    *outptr6++ = r0[6];
                    *outptr7++ = r0[7];

                    r0 += 8;
                }
            }
        }
        if (pack4to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* r0 = bottom_blob.row(i * 2);
                const float* r1 = bottom_blob.row(i * 2 + 1);

                float* outptr = top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    outptr[0] = r0[0];
                    outptr[1] = r0[1];
                    outptr[2] = r0[2];
                    outptr[3] = r0[3];
                    outptr[4] = r1[0];
                    outptr[5] = r1[1];
                    outptr[6] = r1[2];
                    outptr[7] = r1[3];

                    r0 += 4;
                    r1 += 4;
                    outptr += 8;
                }
            }
        }
        if (pack8to4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* r0 = bottom_blob.row(i);

                float* outptr0 = top_blob.row(i * 2);
                float* outptr1 = top_blob.row(i * 2 + 1);

                for (int j = 0; j < w; j++)
                {
                    outptr0[0] = r0[0];
                    outptr0[1] = r0[1];
                    outptr0[2] = r0[2];
                    outptr0[3] = r0[3];
                    outptr1[0] = r0[4];
                    outptr1[1] = r0[5];
                    outptr1[2] = r0[6];
                    outptr1[3] = r0[7];

                    r0 += 8;
                    outptr0 += 4;
                    outptr1 += 4;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int size = w * h * d;
        int outc = channels * elempack / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if (dims == 3)
            top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        else // if (dims == 4)
            top_blob.create(w, h, d, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pack1to4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const float* r0 = bottom_blob.channel(q * 4);
                const float* r1 = bottom_blob.channel(q * 4 + 1);
                const float* r2 = bottom_blob.channel(q * 4 + 2);
                const float* r3 = bottom_blob.channel(q * 4 + 3);

                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;

                    outptr += 4;
                }
            }
        }
        if (pack4to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* r0 = bottom_blob.channel(q);

                float* outptr0 = top_blob.channel(q * 4);
                float* outptr1 = top_blob.channel(q * 4 + 1);
                float* outptr2 = top_blob.channel(q * 4 + 2);
                float* outptr3 = top_blob.channel(q * 4 + 3);

                for (int i = 0; i < size; i++)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];

                    r0 += 4;
                }
            }
        }
        if (pack1to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const float* r0 = bottom_blob.channel(q * 8);
                const float* r1 = bottom_blob.channel(q * 8 + 1);
                const float* r2 = bottom_blob.channel(q * 8 + 2);
                const float* r3 = bottom_blob.channel(q * 8 + 3);
                const float* r4 = bottom_blob.channel(q * 8 + 4);
                const float* r5 = bottom_blob.channel(q * 8 + 5);
                const float* r6 = bottom_blob.channel(q * 8 + 6);
                const float* r7 = bottom_blob.channel(q * 8 + 7);

                float* outptr = top_blob.channel(q);

#if __AVX__
                int nn = size >> 3;
                int remain = size & 7;
#else
                int remain = size;
#endif

#if __AVX__
                for (; nn > 0; nn--)
                {
                    __m256 _row0 = _mm256_loadu_ps(r0);
                    __m256 _row1 = _mm256_loadu_ps(r1);
                    __m256 _row2 = _mm256_loadu_ps(r2);
                    __m256 _row3 = _mm256_loadu_ps(r3);
                    __m256 _row4 = _mm256_loadu_ps(r4);
                    __m256 _row5 = _mm256_loadu_ps(r5);
                    __m256 _row6 = _mm256_loadu_ps(r6);
                    __m256 _row7 = _mm256_loadu_ps(r7);
                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);
                    _mm256_storeu_ps(outptr, _row0);
                    _mm256_storeu_ps(outptr + 8, _row1);
                    _mm256_storeu_ps(outptr + 16, _row2);
                    _mm256_storeu_ps(outptr + 24, _row3);
                    _mm256_storeu_ps(outptr + 32, _row4);
                    _mm256_storeu_ps(outptr + 40, _row5);
                    _mm256_storeu_ps(outptr + 48, _row6);
                    _mm256_storeu_ps(outptr + 56, _row7);
                    r0 += 8;
                    r1 += 8;
                    r2 += 8;
                    r3 += 8;
                    r4 += 8;
                    r5 += 8;
                    r6 += 8;
                    r7 += 8;
                    outptr += 64;
                }
#endif
                for (; remain > 0; remain--)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;
                    outptr[4] = *r4++;
                    outptr[5] = *r5++;
                    outptr[6] = *r6++;
                    outptr[7] = *r7++;

                    outptr += 8;
                }
            }
        }
        if (pack8to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* r0 = bottom_blob.channel(q);

                float* outptr0 = top_blob.channel(q * 8);
                float* outptr1 = top_blob.channel(q * 8 + 1);
                float* outptr2 = top_blob.channel(q * 8 + 2);
                float* outptr3 = top_blob.channel(q * 8 + 3);
                float* outptr4 = top_blob.channel(q * 8 + 4);
                float* outptr5 = top_blob.channel(q * 8 + 5);
                float* outptr6 = top_blob.channel(q * 8 + 6);
                float* outptr7 = top_blob.channel(q * 8 + 7);
#if __AVX__
                int nn = size >> 3;
                int remain = size & 7;
#else
                int remain = size;
#endif

#if __AVX__
                for (; nn > 0; nn--)
                {
                    __m256 _row0 = _mm256_loadu_ps(r0);
                    __m256 _row1 = _mm256_loadu_ps(r0 + 8);
                    __m256 _row2 = _mm256_loadu_ps(r0 + 16);
                    __m256 _row3 = _mm256_loadu_ps(r0 + 24);
                    __m256 _row4 = _mm256_loadu_ps(r0 + 32);
                    __m256 _row5 = _mm256_loadu_ps(r0 + 40);
                    __m256 _row6 = _mm256_loadu_ps(r0 + 48);
                    __m256 _row7 = _mm256_loadu_ps(r0 + 56);
                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);
                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    r0 += 64;
                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                }
#endif

                for (; remain > 0; remain--)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];
                    *outptr4++ = r0[4];
                    *outptr5++ = r0[5];
                    *outptr6++ = r0[6];
                    *outptr7++ = r0[7];

                    r0 += 8;
                }
            }
        }
        if (pack4to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const float* r0 = bottom_blob.channel(q * 2);
                const float* r1 = bottom_blob.channel(q * 2 + 1);

                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[0] = r0[0];
                    outptr[1] = r0[1];
                    outptr[2] = r0[2];
                    outptr[3] = r0[3];
                    outptr[4] = r1[0];
                    outptr[5] = r1[1];
                    outptr[6] = r1[2];
                    outptr[7] = r1[3];

                    r0 += 4;
                    r1 += 4;
                    outptr += 8;
                }
            }
        }
        if (pack8to4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* r0 = bottom_blob.channel(q);

                float* outptr0 = top_blob.channel(q * 2);
                float* outptr1 = top_blob.channel(q * 2 + 1);

                for (int i = 0; i < size; i++)
                {
                    outptr0[0] = r0[0];
                    outptr0[1] = r0[1];
                    outptr0[2] = r0[2];
                    outptr0[3] = r0[3];
                    outptr1[0] = r0[4];
                    outptr1[1] = r0[5];
                    outptr1[2] = r0[6];
                    outptr1[3] = r0[7];

                    r0 += 8;
                    outptr0 += 4;
                    outptr1 += 4;
                }
            }
        }

        return 0;
    }

    return 0;
}